

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifile.cpp
# Opt level: O1

void __thiscall ifile::ifile_t::error(ifile_t *this,char *msg,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined8 local_e8;
  void **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  fprintf(_stderr,"\nERROR (file: %s, line: %ld, column: %ld): ",this->path,this->line,this->col);
  local_e8 = 0x3000000010;
  local_e0 = &args[0].overflow_arg_area;
  local_d8 = local_c8;
  vfprintf(_stderr,msg,&local_e8);
  fputc(10,_stderr);
  exit(1);
}

Assistant:

void ifile_t::error( const char * msg, ... ) const
    {
        va_list args;
        fprintf( stderr, "\nERROR (file: %s, line: %ld, column: %ld): ", path, line, col );
        va_start( args, msg );
        vfprintf( stderr, msg, args );
        va_end( args );
        fprintf( stderr, "\n" );
        exit( 1 );
    }